

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Version::Version
          (Version *this,uint _majorVersion,uint _minorVersion,uint _patchNumber,string *_branchName
          ,uint _buildNumber)

{
  pointer pcVar1;
  
  this->majorVersion = _majorVersion;
  this->minorVersion = _minorVersion;
  this->patchNumber = _patchNumber;
  (this->branchName)._M_dataplus._M_p = (pointer)&(this->branchName).field_2;
  pcVar1 = (_branchName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->branchName,pcVar1,pcVar1 + _branchName->_M_string_length);
  this->buildNumber = _buildNumber;
  return;
}

Assistant:

Version::Version
	(unsigned int _majorVersion,
		unsigned int _minorVersion,
		unsigned int _patchNumber,
		std::string const& _branchName,
		unsigned int _buildNumber)
		: majorVersion(_majorVersion),
		minorVersion(_minorVersion),
		patchNumber(_patchNumber),
		branchName(_branchName),
		buildNumber(_buildNumber)
	{}